

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O1

void __thiscall
btConeTwistConstraint::computeConeLimitInfo
          (btConeTwistConstraint *this,btQuaternion *qCone,btScalar *swingAngle,
          btVector3 *vSwingAxis,btScalar *swingLimit)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  float fVar4;
  btScalar bVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  fVar4 = (qCone->super_btQuadWord).m_floats[3];
  fVar6 = -1.0;
  if (-1.0 <= fVar4) {
    fVar6 = fVar4;
  }
  fVar4 = 1.0;
  if (fVar6 <= 1.0) {
    fVar4 = fVar6;
  }
  fVar4 = acosf(fVar4);
  *swingAngle = fVar4 + fVar4;
  if (1.1920929e-07 < fVar4 + fVar4) {
    fVar4 = (qCone->super_btQuadWord).m_floats[2];
    uVar2 = *(undefined8 *)(qCone->super_btQuadWord).m_floats;
    fVar6 = (float)((ulong)uVar2 >> 0x20);
    *(undefined8 *)vSwingAxis->m_floats = uVar2;
    vSwingAxis->m_floats[2] = fVar4;
    vSwingAxis->m_floats[3] = 0.0;
    fVar4 = fVar4 * fVar4 + (float)uVar2 * (float)uVar2 + fVar6 * fVar6;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = 1.0 / fVar4;
    vSwingAxis->m_floats[0] = vSwingAxis->m_floats[0] * fVar4;
    fVar6 = fVar4 * (float)*(undefined8 *)(vSwingAxis->m_floats + 1);
    fVar4 = fVar4 * (float)((ulong)*(undefined8 *)(vSwingAxis->m_floats + 1) >> 0x20);
    *(ulong *)(vSwingAxis->m_floats + 1) = CONCAT44(fVar4,fVar6);
    *swingLimit = this->m_swingSpan1;
    if (1.1920929e-07 < ABS(fVar6)) {
      fVar4 = (fVar4 * fVar4) / (fVar6 * fVar6);
      uVar1 = this->m_swingSpan1;
      uVar3 = this->m_swingSpan2;
      auVar7._4_4_ = 0x3f800000;
      auVar7._0_4_ = fVar4;
      auVar7._8_8_ = 0;
      auVar8._4_4_ = (float)uVar3 * (float)uVar3;
      auVar8._0_4_ = (float)uVar1 * (float)uVar1;
      auVar8._8_8_ = 0;
      auVar8 = divps(auVar7,auVar8);
      fVar4 = (fVar4 + 1.0) / (auVar8._4_4_ + auVar8._0_4_);
      if (fVar4 < 0.0) {
        bVar5 = sqrtf(fVar4);
      }
      else {
        bVar5 = SQRT(fVar4);
      }
      *swingLimit = bVar5;
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::computeConeLimitInfo(const btQuaternion& qCone,
												 btScalar& swingAngle, // out
												 btVector3& vSwingAxis, // out
												 btScalar& swingLimit) // out
{
	swingAngle = qCone.getAngle();
	if (swingAngle > SIMD_EPSILON)
	{
		vSwingAxis = btVector3(qCone.x(), qCone.y(), qCone.z());
		vSwingAxis.normalize();
#if 0
        // non-zero twist?! this should never happen.
       btAssert(fabs(vSwingAxis.x()) <= SIMD_EPSILON));
#endif
        
		// Compute limit for given swing. tricky:
		// Given a swing axis, we're looking for the intersection with the bounding cone ellipse.
		// (Since we're dealing with angles, this ellipse is embedded on the surface of a sphere.)

		// For starters, compute the direction from center to surface of ellipse.
		// This is just the perpendicular (ie. rotate 2D vector by PI/2) of the swing axis.
		// (vSwingAxis is the cone rotation (in z,y); change vars and rotate to (x,y) coords.)
		btScalar xEllipse =  vSwingAxis.y();
		btScalar yEllipse = -vSwingAxis.z();

		// Now, we use the slope of the vector (using x/yEllipse) and find the length
		// of the line that intersects the ellipse:
		//  x^2   y^2
		//  --- + --- = 1, where a and b are semi-major axes 2 and 1 respectively (ie. the limits)
		//  a^2   b^2
		// Do the math and it should be clear.

		swingLimit = m_swingSpan1; // if xEllipse == 0, we have a pure vSwingAxis.z rotation: just use swingspan1
		if (fabs(xEllipse) > SIMD_EPSILON)
		{
			btScalar surfaceSlope2 = (yEllipse*yEllipse)/(xEllipse*xEllipse);
			btScalar norm = 1 / (m_swingSpan2 * m_swingSpan2);
			norm += surfaceSlope2 / (m_swingSpan1 * m_swingSpan1);
			btScalar swingLimit2 = (1 + surfaceSlope2) / norm;
			swingLimit = sqrt(swingLimit2);
		}

		// test!
		/*swingLimit = m_swingSpan2;
		if (fabs(vSwingAxis.z()) > SIMD_EPSILON)
		{
		btScalar mag_2 = m_swingSpan1*m_swingSpan1 + m_swingSpan2*m_swingSpan2;
		btScalar sinphi = m_swingSpan2 / sqrt(mag_2);
		btScalar phi = asin(sinphi);
		btScalar theta = atan2(fabs(vSwingAxis.y()),fabs(vSwingAxis.z()));
		btScalar alpha = 3.14159f - theta - phi;
		btScalar sinalpha = sin(alpha);
		swingLimit = m_swingSpan1 * sinphi/sinalpha;
		}*/
	}
	else if (swingAngle < 0)
	{
		// this should never happen!
#if 0
        btAssert(0);
#endif
 	}
}